

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O3

void __thiscall Assimp::TriangulateProcess::Execute(TriangulateProcess *this,aiScene *pScene)

{
  bool bVar1;
  uint uVar2;
  Logger *pLVar3;
  ulong uVar4;
  byte bVar5;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"TriangulateProcess begin");
  uVar2 = pScene->mNumMeshes;
  if (uVar2 != 0) {
    uVar4 = 0;
    bVar5 = 0;
    do {
      if (pScene->mMeshes[uVar4] != (aiMesh *)0x0) {
        bVar1 = TriangulateMesh((TriangulateProcess *)pLVar3,pScene->mMeshes[uVar4]);
        bVar5 = bVar5 | bVar1;
        uVar2 = pScene->mNumMeshes;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
    if (bVar5 != 0) {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"TriangulateProcess finished. All polygons have been triangulated.");
      return;
    }
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"TriangulateProcess finished. There was nothing to be done.");
  return;
}

Assistant:

void TriangulateProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TriangulateProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if (pScene->mMeshes[ a ]) {
            if ( TriangulateMesh( pScene->mMeshes[ a ] ) ) {
                bHas = true;
            }
        }
    }
    if ( bHas ) {
        ASSIMP_LOG_INFO( "TriangulateProcess finished. All polygons have been triangulated." );
    } else {
        ASSIMP_LOG_DEBUG( "TriangulateProcess finished. There was nothing to be done." );
    }
}